

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O0

void __thiscall ExampleAppDocuments::ExampleAppDocuments(ExampleAppDocuments *this)

{
  MyDocument *in_RDI;
  MyDocument *in_stack_fffffffffffffe88;
  ImVector<MyDocument> *in_stack_fffffffffffffe90;
  MyDocument *this_00;
  char *in_stack_fffffffffffffe98;
  MyDocument *name;
  MyDocument *in_stack_fffffffffffffea0;
  MyDocument *this_01;
  ImVec4 local_138 [3];
  ImVec4 local_108 [3];
  ImVec4 local_d8 [3];
  ImVec4 local_a8 [3];
  ImVec4 local_78 [4];
  ImVec4 local_38 [3];
  
  ImVector<MyDocument>::ImVector((ImVector<MyDocument> *)in_RDI);
  ImVec4::ImVec4(local_38,0.4,0.8,0.4,1.0);
  MyDocument::MyDocument
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0),(ImVec4 *)in_stack_fffffffffffffe88);
  ImVector<MyDocument>::push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ImVec4::ImVec4(local_78,0.8,0.5,1.0,1.0);
  MyDocument::MyDocument
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0),(ImVec4 *)in_stack_fffffffffffffe88);
  ImVector<MyDocument>::push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  this_01 = in_RDI;
  ImVec4::ImVec4(local_a8,1.0,0.8,0.5,1.0);
  MyDocument::MyDocument
            (this_01,in_stack_fffffffffffffe98,SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0),
             (ImVec4 *)in_stack_fffffffffffffe88);
  ImVector<MyDocument>::push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  name = in_RDI;
  ImVec4::ImVec4(local_d8,1.0,0.3,0.4,1.0);
  MyDocument::MyDocument
            (this_01,(char *)name,SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0),
             (ImVec4 *)in_stack_fffffffffffffe88);
  ImVector<MyDocument>::push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  this_00 = in_RDI;
  ImVec4::ImVec4(local_108,1.0,1.0,1.0,1.0);
  MyDocument::MyDocument
            (this_01,(char *)name,SUB81((ulong)this_00 >> 0x38,0),
             (ImVec4 *)in_stack_fffffffffffffe88);
  ImVector<MyDocument>::push_back((ImVector<MyDocument> *)this_00,in_stack_fffffffffffffe88);
  ImVec4::ImVec4(local_138,1.0,1.0,1.0,1.0);
  MyDocument::MyDocument(this_01,(char *)name,SUB81((ulong)this_00 >> 0x38,0),(ImVec4 *)in_RDI);
  ImVector<MyDocument>::push_back((ImVector<MyDocument> *)this_00,in_RDI);
  return;
}

Assistant:

ExampleAppDocuments()
    {
        Documents.push_back(MyDocument("Lettuce",             true,  ImVec4(0.4f, 0.8f, 0.4f, 1.0f)));
        Documents.push_back(MyDocument("Eggplant",            true,  ImVec4(0.8f, 0.5f, 1.0f, 1.0f)));
        Documents.push_back(MyDocument("Carrot",              true,  ImVec4(1.0f, 0.8f, 0.5f, 1.0f)));
        Documents.push_back(MyDocument("Tomato",              false, ImVec4(1.0f, 0.3f, 0.4f, 1.0f)));
        Documents.push_back(MyDocument("A Rather Long Title", false));
        Documents.push_back(MyDocument("Some Document",       false));
    }